

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intFrames.c
# Opt level: O0

Aig_Man_t * Inter_ManFramesInter(Aig_Man_t *pAig,int nFrames,int fAddRegOuts,int fUseTwoFrames)

{
  Vec_Ptr_t *pVVar1;
  int iVar2;
  int iVar3;
  Aig_Man_t *p;
  Aig_Obj_t *pAVar4;
  Aig_Obj_t *pAVar5;
  void *pvVar6;
  Aig_Obj_t *p1;
  int local_50;
  int local_4c;
  int f;
  int i;
  Aig_Obj_t *pLastPo;
  Aig_Obj_t *pObjLo;
  Aig_Obj_t *pObjLi;
  Aig_Obj_t *pObj;
  Aig_Man_t *pFrames;
  int fUseTwoFrames_local;
  int fAddRegOuts_local;
  int nFrames_local;
  Aig_Man_t *pAig_local;
  
  _f = (Aig_Obj_t *)0x0;
  iVar2 = Saig_ManRegNum(pAig);
  if (iVar2 < 1) {
    __assert_fail("Saig_ManRegNum(pAig) > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/int/intFrames.c"
                  ,0x35,"Aig_Man_t *Inter_ManFramesInter(Aig_Man_t *, int, int, int)");
  }
  iVar2 = Saig_ManPoNum(pAig);
  iVar3 = Saig_ManConstrNum(pAig);
  if (iVar2 - iVar3 != 1) {
    __assert_fail("Saig_ManPoNum(pAig)-Saig_ManConstrNum(pAig) == 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/int/intFrames.c"
                  ,0x36,"Aig_Man_t *Inter_ManFramesInter(Aig_Man_t *, int, int, int)");
  }
  iVar2 = Aig_ManNodeNum(pAig);
  p = Aig_ManStart(iVar2 * nFrames);
  pAVar4 = Aig_ManConst1(p);
  pAVar5 = Aig_ManConst1(pAig);
  (pAVar5->field_5).pData = pAVar4;
  if (fAddRegOuts == 0) {
    for (local_4c = 0; iVar2 = Saig_ManRegNum(pAig), local_4c < iVar2; local_4c = local_4c + 1) {
      pVVar1 = pAig->vCis;
      iVar2 = Saig_ManPiNum(pAig);
      pvVar6 = Vec_PtrEntry(pVVar1,local_4c + iVar2);
      pAVar4 = Aig_ObjCreateCi(p);
      *(Aig_Obj_t **)((long)pvVar6 + 0x28) = pAVar4;
    }
  }
  else {
    for (local_4c = 0; iVar2 = Saig_ManRegNum(pAig), local_4c < iVar2; local_4c = local_4c + 1) {
      pVVar1 = pAig->vCis;
      iVar2 = Saig_ManPiNum(pAig);
      pvVar6 = Vec_PtrEntry(pVVar1,local_4c + iVar2);
      pAVar4 = Aig_ManConst0(p);
      *(Aig_Obj_t **)((long)pvVar6 + 0x28) = pAVar4;
    }
  }
  for (local_50 = 0; local_50 < nFrames; local_50 = local_50 + 1) {
    for (local_4c = 0; iVar2 = Saig_ManPiNum(pAig), local_4c < iVar2; local_4c = local_4c + 1) {
      pvVar6 = Vec_PtrEntry(pAig->vCis,local_4c);
      pAVar4 = Aig_ObjCreateCi(p);
      *(Aig_Obj_t **)((long)pvVar6 + 0x28) = pAVar4;
    }
    for (local_4c = 0; iVar2 = Vec_PtrSize(pAig->vObjs), local_4c < iVar2; local_4c = local_4c + 1)
    {
      pAVar4 = (Aig_Obj_t *)Vec_PtrEntry(pAig->vObjs,local_4c);
      if ((pAVar4 != (Aig_Obj_t *)0x0) && (iVar2 = Aig_ObjIsNode(pAVar4), iVar2 != 0)) {
        pAVar5 = Aig_ObjChild0Copy(pAVar4);
        p1 = Aig_ObjChild1Copy(pAVar4);
        pAVar5 = Aig_And(p,pAVar5,p1);
        (pAVar4->field_5).pData = pAVar5;
      }
    }
    for (local_4c = 0; iVar2 = Saig_ManPoNum(pAig), local_4c < iVar2; local_4c = local_4c + 1) {
      pAVar4 = (Aig_Obj_t *)Vec_PtrEntry(pAig->vCos,local_4c);
      iVar2 = Saig_ManPoNum(pAig);
      iVar3 = Saig_ManConstrNum(pAig);
      if (iVar2 - iVar3 <= local_4c) {
        pAVar4 = Aig_ObjChild0Copy(pAVar4);
        pAVar4 = Aig_Not(pAVar4);
        Aig_ObjCreateCo(p,pAVar4);
      }
    }
    if (local_50 == nFrames + -1) break;
    pAVar4 = Aig_ManCo(pAig,0);
    _f = Aig_ObjChild0Copy(pAVar4);
    for (local_4c = 0; iVar2 = Saig_ManRegNum(pAig), local_4c < iVar2; local_4c = local_4c + 1) {
      pVVar1 = pAig->vCos;
      iVar2 = Saig_ManPoNum(pAig);
      pAVar4 = (Aig_Obj_t *)Vec_PtrEntry(pVVar1,local_4c + iVar2);
      pAVar5 = Aig_ObjChild0Copy(pAVar4);
      (pAVar4->field_5).pData = pAVar5;
    }
    for (local_4c = 0; iVar2 = Saig_ManRegNum(pAig), local_4c < iVar2; local_4c = local_4c + 1) {
      pAVar4 = Saig_ManLi(pAig,local_4c);
      pAVar5 = Saig_ManLo(pAig,local_4c);
      pAVar5->field_5 = pAVar4->field_5;
    }
  }
  if (fAddRegOuts == 0) {
    pAVar4 = Aig_ManCo(pAig,0);
    if ((_f == (Aig_Obj_t *)0x0) || (fUseTwoFrames == 0)) {
      _f = Aig_ObjChild0Copy(pAVar4);
    }
    else {
      pAVar4 = Aig_ObjChild0Copy(pAVar4);
      _f = Aig_Or(p,_f,pAVar4);
    }
    Aig_ObjCreateCo(p,_f);
  }
  else {
    for (local_4c = 0; iVar2 = Saig_ManRegNum(pAig), local_4c < iVar2; local_4c = local_4c + 1) {
      pVVar1 = pAig->vCos;
      iVar2 = Saig_ManPoNum(pAig);
      pAVar4 = (Aig_Obj_t *)Vec_PtrEntry(pVVar1,local_4c + iVar2);
      pAVar4 = Aig_ObjChild0Copy(pAVar4);
      Aig_ObjCreateCo(p,pAVar4);
    }
  }
  Aig_ManCleanup(p);
  return p;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Create timeframes of the manager for interpolation.]

  Description [The resulting manager is combinational. The primary inputs
  corresponding to register outputs are ordered first. The only POs of the 
  manager is the property output of the last timeframe.]
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
Aig_Man_t * Inter_ManFramesInter( Aig_Man_t * pAig, int nFrames, int fAddRegOuts, int fUseTwoFrames )
{
    Aig_Man_t * pFrames;
    Aig_Obj_t * pObj, * pObjLi, * pObjLo;
    Aig_Obj_t * pLastPo = NULL;
    int i, f;
    assert( Saig_ManRegNum(pAig) > 0 );
    assert( Saig_ManPoNum(pAig)-Saig_ManConstrNum(pAig) == 1 );
    pFrames = Aig_ManStart( Aig_ManNodeNum(pAig) * nFrames );
    // map the constant node
    Aig_ManConst1(pAig)->pData = Aig_ManConst1( pFrames );
    // create variables for register outputs
    if ( fAddRegOuts )
    {
        Saig_ManForEachLo( pAig, pObj, i )
            pObj->pData = Aig_ManConst0( pFrames );
    }
    else
    {
        Saig_ManForEachLo( pAig, pObj, i )
            pObj->pData = Aig_ObjCreateCi( pFrames );
    }
    // add timeframes
    for ( f = 0; f < nFrames; f++ )
    {
        // create PI nodes for this frame
        Saig_ManForEachPi( pAig, pObj, i )
            pObj->pData = Aig_ObjCreateCi( pFrames );
        // add internal nodes of this frame
        Aig_ManForEachNode( pAig, pObj, i )
            pObj->pData = Aig_And( pFrames, Aig_ObjChild0Copy(pObj), Aig_ObjChild1Copy(pObj) );
        // add outputs for constraints
        Saig_ManForEachPo( pAig, pObj, i )
        {
            if ( i < Saig_ManPoNum(pAig)-Saig_ManConstrNum(pAig) )
                continue;
            Aig_ObjCreateCo( pFrames, Aig_Not( Aig_ObjChild0Copy(pObj) ) );
        }
        if ( f == nFrames - 1 )
            break;
        // remember the last PO
        pObj = Aig_ManCo( pAig, 0 );
        pLastPo = Aig_ObjChild0Copy(pObj);
        // save register inputs
        Saig_ManForEachLi( pAig, pObj, i )
            pObj->pData = Aig_ObjChild0Copy(pObj);
        // transfer to register outputs
        Saig_ManForEachLiLo(  pAig, pObjLi, pObjLo, i )
            pObjLo->pData = pObjLi->pData;
    }
    // create POs for each register output
    if ( fAddRegOuts )
    {
        Saig_ManForEachLi( pAig, pObj, i )
            Aig_ObjCreateCo( pFrames, Aig_ObjChild0Copy(pObj) );
    }
    // create the only PO of the manager
    else
    {
        pObj = Aig_ManCo( pAig, 0 );
        // add the last PO
        if ( pLastPo == NULL || !fUseTwoFrames )
            pLastPo = Aig_ObjChild0Copy(pObj);
        else
            pLastPo = Aig_Or( pFrames, pLastPo, Aig_ObjChild0Copy(pObj) );
        Aig_ObjCreateCo( pFrames, pLastPo );
    }
    Aig_ManCleanup( pFrames );
    return pFrames;
}